

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_cdata_index(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  char cVar2;
  ushort uVar3;
  RecordFFData *pRVar4;
  ushort uVar5;
  uint uVar6;
  IRType IVar7;
  TRef TVar8;
  uint uVar9;
  CTSize CVar10;
  TRef TVar11;
  GCcdata *pGVar12;
  CType *pCVar13;
  CType *ct;
  cTValue *pcVar14;
  byte bVar15;
  TRef *pTVar16;
  int iVar17;
  uint64_t u64;
  IRRef1 IVar18;
  uint uVar19;
  ulong uVar20;
  CType *pCVar21;
  CTInfo CVar22;
  CTState *cts;
  GCobj *o;
  ptrdiff_t ofs;
  CTSize fofs;
  TRef local_64;
  uint64_t local_50;
  RecordFFData *local_48;
  uint local_3c;
  ulong local_38;
  
  local_64 = *J->base;
  local_50 = 8;
  pGVar12 = argv2cdata(J,local_64,rd->argv);
  cts = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  pCVar13 = cts->tab;
  uVar6 = pCVar13[pGVar12->ctypeid].info;
  ct = pCVar13 + pGVar12->ctypeid;
  local_48 = rd;
  if ((uVar6 & 0xf0000000) == 0x20000000) {
    pCVar1 = &ct->size;
    if ((~uVar6 & 0x20800000) == 0) {
      ct = (CType *)((long)&pCVar13->info + (ulong)((uVar6 & 0xffff) << 4));
    }
    (J->fold).ins.field_0.ot = (ushort)(*pCVar1 == 8) * 4 + 0x4405;
    (J->fold).ins.field_0.op1 = (IRRef1)local_64;
    (J->fold).ins.field_0.op2 = 0xf;
    TVar8 = lj_opt_fold(J);
    local_50 = 0;
    local_64 = crec_reassoc_ofs((jit_State *)&((J->cur).ir)->field_0,J->flags,
                                (ptrdiff_t *)(ulong)TVar8,(MSize)&local_50);
  }
LAB_00156338:
  uVar6 = J->base[1];
  if ((uVar6 >> 0x18 & 0x1e) - 0xe < 6) {
    uVar6 = lj_opt_narrow_cindex(J,uVar6);
    if ((ct->info & 0xe0000000) != 0x20000000) goto LAB_0015671a;
LAB_0015663f:
    uVar9 = ct->info;
    if ((uVar9 >> 0x1a & 1) != 0) {
      TVar8 = lj_ir_kint64(J,1);
      (J->fold).ins.field_0.ot = 0x2115;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      uVar6 = lj_opt_fold(J);
      uVar9 = (uint)(ushort)ct->info;
    }
    local_38 = (ulong)(uVar9 & 0xffff);
    CVar10 = lj_ctype_size(cts,uVar9 & 0xffff);
    TVar8 = crec_reassoc_ofs((jit_State *)&((J->cur).ir)->field_0,J->flags,(ptrdiff_t *)(ulong)uVar6
                             ,(MSize)&local_50);
    TVar11 = lj_ir_kint64(J,(ulong)CVar10);
    (J->fold).ins.field_0.ot = 0x2b15;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
    uVar6 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)local_64;
    local_64 = lj_opt_fold(J);
    uVar9 = (uint)local_38;
    rd = local_48;
  }
  else {
    IVar18 = (IRRef1)uVar6;
    if ((uVar6 & 0x1f000000) != 0x4000000) {
      if ((uVar6 & 0x1f000000) == 0xa000000) {
        pCVar13 = cts->tab + *(ushort *)((ulong)rd->argv[1].u32.lo + 6);
        IVar7 = crec_ct2irt(cts,pCVar13);
        if (((ct->info & 0xe0000000) == 0x20000000) && (IRT_NUM < IVar7)) {
          uVar5 = 0x4400;
          if (pCVar13->size == 8) {
            IVar18 = 0x11;
          }
          else if (pCVar13->size == 4) {
            IVar18 = 0x10;
          }
          else {
            TVar8 = lj_ir_kint64(J,8);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar18;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
            uVar6 = lj_opt_fold(J);
            uVar5 = 0x4500;
            IVar18 = 0;
          }
          (J->fold).ins.field_0.ot = uVar5 | (ushort)IVar7;
          (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
          (J->fold).ins.field_0.op2 = IVar18;
          uVar6 = lj_opt_fold(J);
          if ((pCVar13->size < 8) && ((pCVar13->info & 0x800000) == 0)) {
            (J->fold).ins.field_0.op1 = (IRRef1)uVar6;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x59150ab3;
            uVar6 = lj_opt_fold(J);
          }
          goto LAB_0015663f;
        }
      }
      goto LAB_0015671a;
    }
    o = (GCobj *)(ulong)rd->argv[1].u32.lo;
    if ((pGVar12 != (GCcdata *)0x0) && (pGVar12->ctypeid == 0x15)) {
      uVar9 = pGVar12[1].nextgc.gcptr32;
      crec_constructor(J,(GCcdata *)(ulong)uVar9,local_64);
      ct = cts->tab + uVar9;
      rd = local_48;
    }
    if ((ct->info & 0xf0000000) != 0x10000000) {
      if (((ct->info & 0xf4000000) == 0x34000000) && ((o->str).len == 2)) {
        cVar2 = (char)(o->gch).metatable.gcptr32;
        if (cVar2 == 'i') {
          if (*(char *)((long)&(o->gch).metatable.gcptr32 + 1) == 'm') goto LAB_00156529;
        }
        else if ((cVar2 == 'r') && (*(char *)((long)&(o->gch).metatable.gcptr32 + 1) == 'e')) {
LAB_00156529:
          TVar8 = lj_ir_kgc(J,o,IRT_STR);
          (J->fold).ins.field_0.ot = 0x884;
          (J->fold).ins.field_0.op1 = IVar18;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
          lj_opt_fold(J);
          if ((char)(o->gch).metatable.gcptr32 == 'i') {
            local_50 = local_50 + (ct->size >> 1);
          }
          uVar9 = (uint)(ushort)ct->info;
          goto LAB_0015670f;
        }
      }
      goto LAB_0015671a;
    }
    pCVar13 = lj_ctype_getfieldq(cts,ct,&o->str,&local_3c,(CTInfo *)0x0);
    uVar9 = 0;
    if (pCVar13 != (CType *)0x0) {
      u64 = local_3c + local_50;
      local_50 = u64;
      TVar8 = lj_ir_kgc(J,o,IRT_STR);
      (J->fold).ins.field_0.ot = 0x884;
      (J->fold).ins.field_0.op1 = IVar18;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      lj_opt_fold(J);
      CVar22 = pCVar13->info;
      if (CVar22 >> 0x1c == 10) {
        if (u64 != 0) {
          TVar8 = lj_ir_kint64(J,u64);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = (IRRef1)local_64;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
          local_64 = lj_opt_fold(J);
          CVar22 = pCVar13->info;
        }
        uVar6 = CVar22 >> 0x10 & 0x7f;
        iVar17 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar17 == 0; iVar17 = iVar17 + -1) {
          }
        }
        uVar5 = ((ushort)iVar17 ^ 0x1f) * 2 ^ 0x3e;
        uVar6 = CVar22 & 0x800000;
        uVar3 = (ushort)(uVar6 >> 0x10);
        (J->fold).ins.field_0.ot = uVar5 + (uVar3 >> 7) + 0x450f;
        (J->fold).ins.field_0.op1 = (IRRef1)local_64;
        (J->fold).ins.field_0.op2 = 0;
        TVar8 = lj_opt_fold(J);
        pRVar4 = local_48;
        uVar9 = CVar22 & 0x7f;
        uVar19 = CVar22 >> 8 & 0x7f;
        bVar15 = (byte)uVar19;
        IVar18 = (IRRef1)TVar8;
        if (local_48->data != 0) {
          uVar5 = (uVar3 >> 7) + uVar5 + 0xf;
          iVar17 = 3;
          if ((CVar22 >> 0x1b & 1) == 0) {
            iVar17 = 10 - (uint)(uVar6 == 0);
          }
          uVar6 = ~(-1 << (bVar15 & 0x1f)) << ((byte)uVar9 & 0x1f);
          TVar8 = crec_ct_tv(J,(CType *)((ulong)(uint)(iVar17 << 4) +
                                        *(long *)(ulong)J[-1].bpropcache[0xc].mode),0,J->base[2],
                             local_48->argv + 2);
          TVar11 = lj_ir_kint(J,uVar9);
          (J->fold).ins.field_0.ot = 0x2413;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
          TVar8 = lj_opt_fold(J);
          TVar11 = lj_ir_kint(J,uVar6);
          (J->fold).ins.field_0.ot = uVar5 | 0x2100;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
          TVar8 = lj_opt_fold(J);
          TVar11 = lj_ir_kint(J,~uVar6);
          (J->fold).ins.field_0.ot = uVar5 | 0x2100;
          (J->fold).ins.field_0.op1 = IVar18;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
          TVar11 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = uVar5 | 0x2200;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
          TVar8 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = uVar5 | 0x4c00;
          (J->fold).ins.field_0.op1 = (IRRef1)local_64;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
          lj_opt_fold(J);
          pRVar4->nres = 0;
          J->needsnap = '\x01';
          return;
        }
        if ((CVar22 >> 0x1b & 1) == 0) {
          if (uVar6 == 0) {
            iVar17 = 0x20 - uVar19;
            TVar8 = lj_ir_kint(J,iVar17 - uVar9);
            (J->fold).ins.field_0.ot = 0x2413;
            (J->fold).ins.field_0.op1 = IVar18;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
            TVar8 = lj_opt_fold(J);
            TVar11 = lj_ir_kint(J,iVar17);
            IVar18 = (IRRef1)TVar11;
            (J->fold).ins.field_0.ot = 0x2613;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          }
          else {
            TVar8 = lj_ir_kint(J,uVar9);
            (J->fold).ins.field_0.ot = 0x2513;
            (J->fold).ins.field_0.op1 = IVar18;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
            TVar8 = lj_opt_fold(J);
            TVar11 = lj_ir_kint(J,~(-1 << (bVar15 & 0x1f)));
            IVar18 = (IRRef1)TVar11;
            (J->fold).ins.field_0.ot = 0x2113;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          }
          (J->fold).ins.field_0.op2 = IVar18;
          TVar8 = lj_opt_fold(J);
        }
        else {
          TVar8 = lj_ir_kint(J,1 << ((byte)uVar9 & 0x1f));
          (J->fold).ins.field_0.ot = 0x2113;
          (J->fold).ins.field_0.op1 = IVar18;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
          TVar8 = lj_opt_fold(J);
          TVar11 = lj_ir_kint(J,0);
          (J->fold).ins.field_0.ot = 0x993;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
          J->postproc = LJ_POST_FIXGUARD;
          TVar8 = 0x2007ffd;
        }
        pTVar16 = J->base;
      }
      else {
        if (CVar22 >> 0x1c != 0xb) {
          uVar9 = CVar22 & 0xffff;
          rd = local_48;
          goto LAB_0015670f;
        }
        uVar6 = pCVar13->size;
        if (((int)uVar6 < 0) &&
           ((*(byte *)((long)&cts->tab->info + (ulong)((CVar22 & 0xffff) << 4) + 2) & 0x80) != 0)) {
          TVar8 = lj_ir_knum_u64(J,(uint64_t)(double)uVar6);
        }
        else {
          TVar8 = lj_ir_kint(J,uVar6);
        }
        pTVar16 = J->base;
      }
      goto LAB_00156de2;
    }
  }
LAB_0015670f:
  if (uVar9 != 0) {
    if (local_50 != 0) {
      TVar8 = lj_ir_kint64(J,local_50);
      (J->fold).ins.field_0.ot = 0x2909;
      (J->fold).ins.field_0.op1 = (IRRef1)local_64;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      local_64 = lj_opt_fold(J);
    }
    pCVar13 = (CType *)((long)&cts->tab->info + (ulong)(uVar9 << 4));
    if ((*(uint *)((long)&cts->tab->info + (ulong)(uVar9 << 4)) & 0xf0800000) == 0x20800000) {
      (J->fold).ins.field_0.op1 = (IRRef1)local_64;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090000;
      local_64 = lj_opt_fold(J);
      uVar5 = (ushort)pCVar13->info;
      uVar9 = (uint)uVar5;
      pCVar13 = cts->tab + uVar5;
    }
    if (rd->data != 0) {
      rd->nres = 0;
      J->needsnap = '\x01';
      crec_ct_tv(J,pCVar13,local_64,J->base[2],rd->argv + 2);
      return;
    }
    TVar8 = crec_tv_ct(J,pCVar13,uVar9,local_64);
    pTVar16 = J->base;
LAB_00156de2:
    *pTVar16 = TVar8;
    return;
  }
LAB_0015671a:
  pCVar13 = cts->tab;
  if ((((ct->info & 0xf0000000) != 0x20000000) ||
      (uVar20 = (ulong)((ct->info & 0xffff) << 4),
      pCVar21 = (CType *)((long)&pCVar13->info + uVar20),
      (*(uint *)((long)&pCVar13->info + uVar20) & 0xf0000000) != 0x10000000)) ||
     (pGVar12 = (GCcdata *)0x0, ct = pCVar21, (uVar6 & 0x1f000000) != 0x4000000)) {
    pcVar14 = lj_ctype_meta(cts,(CTypeID)((ulong)((long)ct - (long)pCVar13) >> 4),
                            (uint)(rd->data != 0));
    if (pcVar14 != (cTValue *)0x0) {
      if ((pcVar14->field_2).it == 0xfffffff7) {
        TVar8 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar14->u32).lo,IRT_FUNC);
        J->base[-1] = TVar8 | 0x10000;
        rd->nres = -1;
        return;
      }
      if ((((pcVar14->field_2).it == 0xfffffff4) && (rd->data == 0)) &&
         ((J->base[1] & 0x1f000000) == 0x4000000)) {
        pcVar14 = lj_tab_get(J->L,(GCtab *)(ulong)(pcVar14->u32).lo,rd->argv + 1);
        TVar8 = lj_record_constify(J,pcVar14);
        pTVar16 = J->base;
        *pTVar16 = TVar8;
        if (TVar8 != 0) {
          TVar8 = pTVar16[1];
          TVar11 = lj_ir_kgc(J,(GCobj *)(ulong)rd->argv[1].u32.lo,IRT_STR);
          (J->fold).ins.field_0.ot = 0x884;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
          lj_opt_fold(J);
          return;
        }
      }
    }
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
  goto LAB_00156338;
}

Assistant:

void LJ_FASTCALL recff_cdata_index(jit_State *J, RecordFFData *rd)
{
  TRef idx, ptr = J->base[0];
  ptrdiff_t ofs = sizeof(GCcdata);
  GCcdata *cd = argv2cdata(J, ptr, &rd->argv[0]);
  CTState *cts = ctype_ctsG(J2G(J));
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTypeID sid = 0;

  /* Resolve pointer or reference for cdata object. */
  if (ctype_isptr(ct->info)) {
    IRType t = (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
    if (ctype_isref(ct->info)) ct = ctype_rawchild(cts, ct);
    ptr = emitir(IRT(IR_FLOAD, t), ptr, IRFL_CDATA_PTR);
    ofs = 0;
    ptr = crec_reassoc_ofs(J, ptr, &ofs, 1);
  }

again:
  idx = J->base[1];
  if (tref_isnumber(idx)) {
    idx = lj_opt_narrow_cindex(J, idx);
    if (ctype_ispointer(ct->info)) {
      CTSize sz;
  integer_key:
      if ((ct->info & CTF_COMPLEX))
	idx = emitir(IRT(IR_BAND, IRT_INTP), idx, lj_ir_kintp(J, 1));
      sz = lj_ctype_size(cts, (sid = ctype_cid(ct->info)));
      idx = crec_reassoc_ofs(J, idx, &ofs, sz);
#if LJ_TARGET_ARM || LJ_TARGET_PPC
      /* Hoist base add to allow fusion of index/shift into operands. */
      if (LJ_LIKELY(J->flags & JIT_F_OPT_LOOP) && ofs
#if LJ_TARGET_ARM
	  && (sz == 1 || sz == 4)
#endif
	  ) {
	ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	ofs = 0;
      }
#endif
      idx = emitir(IRT(IR_MUL, IRT_INTP), idx, lj_ir_kintp(J, sz));
      ptr = emitir(IRT(IR_ADD, IRT_PTR), idx, ptr);
    }
  } else if (tref_iscdata(idx)) {
    GCcdata *cdk = cdataV(&rd->argv[1]);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    IRType t = crec_ct2irt(cts, ctk);
    if (ctype_ispointer(ct->info) && t >= IRT_I8 && t <= IRT_U64) {
      if (ctk->size == 8) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT64);
      } else if (ctk->size == 4) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT);
      } else {
	idx = emitir(IRT(IR_ADD, IRT_PTR), idx,
		     lj_ir_kintp(J, sizeof(GCcdata)));
	idx = emitir(IRT(IR_XLOAD, t), idx, 0);
      }
      if (LJ_64 && ctk->size < sizeof(intptr_t) && !(ctk->info & CTF_UNSIGNED))
	idx = emitconv(idx, IRT_INTP, IRT_INT, IRCONV_SEXT);
      if (!LJ_64 && ctk->size > sizeof(intptr_t)) {
	idx = emitconv(idx, IRT_INTP, t, 0);
	lj_needsplit(J);
      }
      goto integer_key;
    }
  } else if (tref_isstr(idx)) {
    GCstr *name = strV(&rd->argv[1]);
    if (cd && cd->ctypeid == CTID_CTYPEID)
      ct = ctype_raw(cts, crec_constructor(J, cd, ptr));
    if (ctype_isstruct(ct->info)) {
      CTSize fofs;
      CType *fct;
      fct = lj_ctype_getfield(cts, ct, name, &fofs);
      if (fct) {
	ofs += (ptrdiff_t)fofs;
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (ctype_isconstval(fct->info)) {
	  if (fct->size >= 0x80000000u &&
	      (ctype_child(cts, fct)->info & CTF_UNSIGNED)) {
	    J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)fct->size);
	    return;
	  }
	  J->base[0] = lj_ir_kint(J, (int32_t)fct->size);
	  return;  /* Interpreter will throw for newindex. */
	} else if (ctype_isbitfield(fct->info)) {
	  if (ofs)
	    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	  crec_index_bf(J, rd, ptr, fct->info);
	  return;
	} else {
	  lj_assertJ(ctype_isfield(fct->info), "field expected");
	  sid = ctype_cid(fct->info);
	}
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2 &&
	  ((strdata(name)[0] == 'r' && strdata(name)[1] == 'e') ||
	   (strdata(name)[0] == 'i' && strdata(name)[1] == 'm'))) {
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (strdata(name)[0] == 'i') ofs += (ct->size >> 1);
	sid = ctype_cid(ct->info);
      }
    }
  }
  if (!sid) {
    if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
      CType *cct = ctype_rawchild(cts, ct);
      if (ctype_isstruct(cct->info)) {
	ct = cct;
	cd = NULL;
	if (tref_isstr(idx)) goto again;
      }
    }
    crec_index_meta(J, cts, ct, rd);
    return;
  }

  if (ofs)
    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));

  /* Resolve reference for field. */
  ct = ctype_get(cts, sid);
  if (ctype_isref(ct->info)) {
    ptr = emitir(IRT(IR_XLOAD, IRT_PTR), ptr, 0);
    sid = ctype_cid(ct->info);
    ct = ctype_get(cts, sid);
  }

  while (ctype_isattrib(ct->info))
    ct = ctype_child(cts, ct);  /* Skip attributes. */

  if (rd->data == 0) {  /* __index metamethod. */
    J->base[0] = crec_tv_ct(J, ct, sid, ptr);
  } else {  /* __newindex metamethod. */
    rd->nres = 0;
    J->needsnap = 1;
    crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
  }
}